

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

Info * __thiscall CMU462::DynamicScene::XFormWidget::getInfo_abi_cxx11_(XFormWidget *this)

{
  long in_RSI;
  Info *in_RDI;
  Info *info;
  value_type *in_stack_ffffffffffffff58;
  allocator *this_00;
  Info *this_01;
  allocator local_79;
  string local_78 [32];
  undefined1 local_58 [40];
  undefined1 local_30 [31];
  undefined1 local_11;
  
  local_11 = 0;
  this_01 = in_RDI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x21608e);
  if (*(long *)(in_RSI + 0xf8) == 0) {
    if (*(long *)(in_RSI + 0xf0) == 0) {
      this_00 = &local_79;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,"TRANSFORMATION",this_00);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00,in_stack_ffffffffffffff58);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
    else {
      (**(code **)(**(long **)(in_RSI + 0xf0) + 0x28))(local_58);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(this_01,in_RDI);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(this_01);
    }
  }
  else {
    (**(code **)(**(long **)(in_RSI + 0xf8) + 0x18))(local_30);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(this_01,in_RDI);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this_01);
  }
  return this_01;
}

Assistant:

Info XFormWidget::getInfo() {
  Info info;

  if (target.element != nullptr) {
    info = target.element->getInfo();
    return info;
  }

  if (target.object != nullptr) {
    info = target.object->getInfo();
    return info;
  }

  info.push_back("TRANSFORMATION");
  return info;
}